

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_unpolar_impl
               (double rho,double sigma,double *eps)

{
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t103;
  double t102;
  double t99;
  double t95;
  double t94;
  double t93;
  double t92;
  double t90;
  double t88;
  double t87;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t79;
  double t72;
  double t68;
  double t65;
  double t63;
  double t62;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t54;
  double t53;
  double t50;
  double t45;
  double t43;
  double t36;
  double t34;
  double t33;
  double t32;
  double t30;
  double t29;
  double t26;
  double t24;
  double t21;
  double t16;
  double t13;
  double t12;
  double t10;
  double t7;
  double t104;
  double t98;
  double t97;
  double t96;
  double t91;
  double t76;
  double t75;
  double t70;
  double t20;
  double t19;
  double t18;
  double t6;
  double t4;
  double t39;
  double t5;
  double t3;
  double t1;
  double in_stack_fffffffffffffdd0;
  
  dVar1 = safe_math::cbrt<double>(9.13136079168959e-318);
  safe_math::sqrt<double>(9.1318103914273e-318);
  pow_3_2<double>(in_stack_fffffffffffffdd0);
  dVar2 = safe_math::log<double>(9.1329862676644e-318);
  dVar3 = safe_math::cbrt<double>(9.13332717296003e-318);
  dVar4 = piecewise_functor_3<double>(false,dVar3 * 1e-15,1.0);
  dVar5 = safe_math::log<double>(9.13476490398943e-318);
  dVar3 = piecewise_functor_3<double>(false,dVar3 * dVar3,1.0);
  safe_math::exp<double>(9.13697337742634e-318);
  dVar6 = safe_math::log<double>(9.13964133191389e-318);
  *in_RDI = -(((2.4814019635975995 / dVar1) * 0.053425 + 1.0) * 0.0621814 * dVar2) +
            ((dVar4 + dVar4 + -2.0) / 0.5198420997897464) * 0.0197516734986138 *
            ((2.4814019635975995 / dVar1) * 0.0278125 + 1.0) * dVar5 +
            dVar3 * dVar3 * dVar3 * 0.031090690869654894 * dVar6;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double& eps ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t39 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t18 = t1 * t1;
    constexpr double t19 = t3 * t3;
    constexpr double t20 = t18 * t19;
    constexpr double t70 = 0.1e1 / t3;
    constexpr double t75 = BB * beta;
    constexpr double t76 = 0.1e1 / gamma;
    constexpr double t91 = t39 * t39;
    constexpr double t96 = 0.1e1 / t19;
    constexpr double t97 = t1 * t96;
    constexpr double t98 = t97 * t6;
    constexpr double t104 = beta * t76;


    const double t7 = safe_math::cbrt( rho );
    const double t10 = t4 * t6 / t7;
    const double t12 = 0.1e1 + 0.53425e-1 * t10;
    const double t13 = safe_math::sqrt( t10 );
    const double t16 = pow_3_2( t10 );
    const double t21 = t7 * t7;
    const double t24 = t20 * t5 / t21;
    const double t26 = 0.379785e1 * t13 + 0.8969e0 * t10 + 0.204775e0 * t16 + 0.123235e0 * t24;
    const double t29 = 0.1e1 + 0.16081979498692535067e2 / t26;
    const double t30 = safe_math::log( t29 );
    const double t32 = 0.621814e-1 * t12 * t30;
    const double t33 = 0.1e1 <= zeta_tol;
    const double t34 = safe_math::cbrt( zeta_tol );
    const double t36 = piecewise_functor_3( t33, t34 * zeta_tol, 1.0 );
    const double t43 = ( 0.2e1 * t36 - 0.2e1 ) / ( 0.2e1 * t39 - 0.2e1 );
    const double t45 = 0.1e1 + 0.278125e-1 * t10;
    const double t50 = 0.51785e1 * t13 + 0.905775e0 * t10 + 0.1100325e0 * t16 + 0.1241775e0 * t24;
    const double t53 = 0.1e1 + 0.29608749977793437516e2 / t50;
    const double t54 = safe_math::log( t53 );
    const double t57 = 0.19751673498613801407e-1 * t43 * t45 * t54;
    const double t58 = t34 * t34;
    const double t59 = piecewise_functor_3( t33, t58, 1.0 );
    const double t60 = t59 * t59;
    const double t61 = t60 * t59;
    const double t62 = gamma * t61;
    const double t63 = rho * rho;
    const double t65 = 0.1e1 / t7 / t63;
    const double t68 = 0.1e1 / t60;
    const double t72 = t68 * t18 * t70 * t5;
    const double t79 = 0.1e1 / t61;
    const double t81 = safe_math::exp( -( -t32 + t57 ) * t76 * t79 );
    const double t82 = t81 - 0.1e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = sigma * sigma;
    const double t87 = t75 * t84 * t85;
    const double t88 = t63 * t63;
    const double t90 = 0.1e1 / t21 / t88;
    const double t92 = t90 * t91;
    const double t93 = t60 * t60;
    const double t94 = 0.1e1 / t93;
    const double t95 = t92 * t94;
    const double t99 = t95 * t98;
    const double t102 = sigma * t65 * t39 * t72 / 0.96e2 + t87 * t99 / 0.3072e4;
    const double t103 = beta * t102;
    const double t107 = t104 * t83 * t102 + 0.1e1;
    const double t108 = 0.1e1 / t107;
    const double t109 = t76 * t108;
    const double t111 = t103 * t109 + 0.1e1;
    const double t112 = safe_math::log( t111 );
    const double t113 = t62 * t112;


    eps = -t32 + t57 + t113;

  }